

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::avgrUI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  Literal *val;
  Literal *this_01;
  long lVar1;
  undefined1 local_1e0 [8];
  LaneArray<8> other_lanes;
  LaneArray<8> lanes;
  Literal local_48;
  
  getLanes<unsigned_short,8>((LaneArray<8> *)&other_lanes._M_elems[7].type,(wasm *)this,other);
  getLanes<unsigned_short,8>((LaneArray<8> *)local_1e0,(wasm *)other,val);
  this_00 = &lanes._M_elems[7].type;
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
    avgrUInt(&local_48,this_01,(Literal *)(local_1e0 + lVar1));
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
  }
  Literal(__return_storage_ptr__,(LaneArray<8> *)&other_lanes._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_1e0);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&other_lanes._M_elems[7].type)
  ;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::avgrUI16x8(const Literal& other) const {
  return binary<8, &Literal::getLanesUI16x8, &Literal::avgrUInt>(*this, other);
}